

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.h
# Opt level: O0

char * lyd_get_value(lyd_node *node)

{
  long lVar1;
  ly_ctx *local_30;
  lyd_node *local_28;
  lyd_value *value;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    node_local = (lyd_node *)0x0;
  }
  else if (node->schema == (lysc_node *)0x0) {
    node_local = node[1].prev;
  }
  else if ((node->schema->nodetype & 0xc) == 0) {
    node_local = (lyd_node *)0x0;
  }
  else {
    local_28 = node + 1;
    lVar1._0_4_ = local_28->hash;
    lVar1._4_4_ = local_28->flags;
    if (lVar1 == 0) {
      if (node->schema == (lysc_node *)0x0) {
        local_30 = (ly_ctx *)node[2].schema;
      }
      else {
        local_30 = node->schema->module->ctx;
      }
      local_28 = (lyd_node *)lyd_value_get_canonical(local_30,(lyd_value *)local_28);
    }
    else {
      local_28 = *(lyd_node **)local_28;
    }
    node_local = local_28;
  }
  return (char *)node_local;
}

Assistant:

static inline const char *
lyd_get_value(const struct lyd_node *node)
{
    if (!node) {
        return NULL;
    }

    if (!node->schema) {
        return ((const struct lyd_node_opaq *)node)->value;
    } else if (node->schema->nodetype & LYD_NODE_TERM) {
        const struct lyd_value *value = &((const struct lyd_node_term *)node)->value;

        return value->_canonical ? value->_canonical : lyd_value_get_canonical(LYD_CTX(node), value);
    }

    return NULL;
}